

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_setup.cpp
# Opt level: O2

void P_LoadZSegs(FileReaderBase *data)

{
  line_t *plVar1;
  uint uVar2;
  side_t *psVar3;
  line_t *plVar4;
  int i;
  long lVar5;
  long lVar6;
  BYTE side;
  WORD line;
  DWORD v2;
  DWORD v1;
  
  lVar6 = 0;
  for (lVar5 = 0; lVar5 < numsegs; lVar5 = lVar5 + 1) {
    (*data->_vptr_FileReaderBase[2])(data,&v1,4);
    (*data->_vptr_FileReaderBase[2])(data,&v2,4);
    (*data->_vptr_FileReaderBase[2])(data,&line,2);
    (*data->_vptr_FileReaderBase[2])(data,&side,1);
    *(vertex_t **)((long)&segs->v1 + lVar6) = vertexes + v1;
    *(vertex_t **)((long)&segs->v2 + lVar6) = vertexes + v2;
    plVar4 = lines;
    plVar1 = lines + line;
    *(line_t **)((long)&segs->linedef + lVar6) = plVar1;
    psVar3 = plVar1->sidedef[side];
    *(side_t **)((long)&segs->sidedef + lVar6) = psVar3;
    *(sector_t **)((long)&segs->frontsector + lVar6) = psVar3->sector;
    uVar2 = plVar4[line].flags;
    if (((uVar2 & 4) == 0) || (plVar1->sidedef[side ^ 1] == (side_t *)0x0)) {
      *(undefined8 *)((long)&segs->backsector + lVar6) = 0;
      plVar1->flags = uVar2 & 0xfffffffb;
    }
    else {
      *(sector_t **)((long)&segs->backsector + lVar6) = plVar1->sidedef[side ^ 1]->sector;
    }
    lVar6 = lVar6 + 0x48;
  }
  return;
}

Assistant:

void P_LoadZSegs (FileReaderBase &data)
{
	for (int i = 0; i < numsegs; ++i)
	{
		line_t *ldef;
		DWORD v1, v2;
		WORD line;
		BYTE side;

		data >> v1 >> v2 >> line >> side;

		segs[i].v1 = &vertexes[v1];
		segs[i].v2 = &vertexes[v2];
		segs[i].linedef = ldef = &lines[line];
		segs[i].sidedef = ldef->sidedef[side];
		segs[i].frontsector = ldef->sidedef[side]->sector;
		if (ldef->flags & ML_TWOSIDED && ldef->sidedef[side^1] != NULL)
		{
			segs[i].backsector = ldef->sidedef[side^1]->sector;
		}
		else
		{
			segs[i].backsector = 0;
			ldef->flags &= ~ML_TWOSIDED;
		}
	}
}